

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::
string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
::load_bytes<char>(string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   *this,enable_if_t<std::is_same<char,_char>::value,_handle> src)

{
  long lVar1;
  long lVar2;
  long *local_48 [2];
  long local_38 [2];
  
  if ((((src.m_ptr)->ob_type->tp_flags & 0x8000000) != 0) &&
     (lVar1 = PyBytes_AsString(src.m_ptr), lVar1 != 0)) {
    lVar2 = PyBytes_Size(src.m_ptr);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,lVar1,lVar2 + lVar1);
    std::__cxx11::string::operator=((string *)this,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    if (lVar1 != 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool load_bytes(enable_if_t<std::is_same<C, char>::value, handle> src) {
        if (PYBIND11_BYTES_CHECK(src.ptr())) {
            // We were passed a Python 3 raw bytes; accept it into a std::string or char*
            // without any encoding attempt.
            const char *bytes = PYBIND11_BYTES_AS_STRING(src.ptr());
            if (bytes) {
                value = StringType(bytes, (size_t) PYBIND11_BYTES_SIZE(src.ptr()));
                return true;
            }
        }

        return false;
    }